

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SchemaToIndex(sqlite3 *db,Schema *pSchema)

{
  int local_1c;
  int i;
  Schema *pSchema_local;
  sqlite3 *db_local;
  
  local_1c = -1000000;
  if (pSchema != (Schema *)0x0) {
    local_1c = 0;
    while ((local_1c < db->nDb && (db->aDb[local_1c].pSchema != pSchema))) {
      local_1c = local_1c + 1;
    }
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3SchemaToIndex(sqlite3 *db, Schema *pSchema){
  int i = -1000000;

  /* If pSchema is NULL, then return -1000000. This happens when code in 
  ** expr.c is trying to resolve a reference to a transient table (i.e. one
  ** created by a sub-select). In this case the return value of this 
  ** function should never be used.
  **
  ** We return -1000000 instead of the more usual -1 simply because using
  ** -1000000 as the incorrect index into db->aDb[] is much 
  ** more likely to cause a segfault than -1 (of course there are assert()
  ** statements too, but it never hurts to play the odds).
  */
  assert( sqlite3_mutex_held(db->mutex) );
  if( pSchema ){
    for(i=0; ALWAYS(i<db->nDb); i++){
      if( db->aDb[i].pSchema==pSchema ){
        break;
      }
    }
    assert( i>=0 && i<db->nDb );
  }
  return i;
}